

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLog::WriteCreateSequence(WriteAheadLog *this,SequenceCatalogEntry *entry)

{
  SequenceCatalogEntry *local_5c0;
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,CREATE_SEQUENCE);
  local_5c0 = entry;
  Serializer::WriteProperty<duckdb::SequenceCatalogEntry_const*>
            (&serializer.serializer.super_Serializer,0x65,"sequence",&local_5c0);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateSequence(const SequenceCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_SEQUENCE);
	serializer.WriteProperty(101, "sequence", &entry);
	serializer.End();
}